

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.h
# Opt level: O1

void SHA1_input(SHA1_CTX *context,uchar *data,size_t len)

{
  uint uVar1;
  ulong __n;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = context->count[0];
  uVar1 = (int)len * 8;
  context->count[0] = uVar1 + uVar2;
  if (CARRY4(uVar1,uVar2)) {
    context->count[1] = context->count[1] + 1;
  }
  context->count[1] = context->count[1] + (int)(len >> 0x1d);
  uVar2 = uVar2 >> 3 & 0x3f;
  uVar3 = (ulong)uVar2;
  if (len + uVar3 < 0x40) {
    __n = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar2);
    memcpy(context->buffer + uVar3,data,__n);
    SHA1_transform(context->state,context->buffer);
    if ((uVar2 ^ 0x7f) < len) {
      uVar2 = uVar2 ^ 0xbf;
      do {
        uVar1 = uVar2;
        SHA1_transform(context->state,data + (uVar1 - 0x7f));
        uVar2 = uVar1 + 0x40;
      } while (uVar1 < len);
      __n = (ulong)(uVar1 - 0x3f);
    }
    uVar3 = 0;
  }
  memcpy(context->buffer + uVar3,data + __n,len - __n);
  return;
}

Assistant:

void SHA1_input(SHA1_CTX* context, const unsigned char* data, size_t len)
{
	uint32_t i = 0;
	uint32_t j = context->count[0];

	if ((context->count[0] += len << 3) < j)
		context->count[1]++;

	context->count[1] += (len >> 29);
	j = (j >> 3) & 63;

	if ((j + len) > 63)
	{
		memcpy(&context->buffer[j], data, (i = 64 - j));
		SHA1_transform(context->state, context->buffer);

		for (; i + 63 < len; i += 64)
			SHA1_transform(context->state, &data[i]);

		j = 0;
	}

	memcpy(&context->buffer[j], &data[i], len - i);
}